

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_bucket_id_mapping.c
# Opt level: O3

double dds_get_max_addressable_value(dds_bucket_id_mapping *bid_mapping)

{
  double dVar1;
  double dVar2;
  double local_8;
  
  if (bid_mapping->type == LOG_LOWER) {
    local_8 = bid_mapping->alpha + 1.0;
  }
  else {
    local_8 = 1.0 - bid_mapping->alpha;
  }
  dVar1 = exp(bid_mapping->log_gamma * 2147483647.0);
  local_8 = 1.79769313486232e+308 / local_8;
  dVar2 = local_8;
  if (dVar1 <= local_8) {
    dVar2 = dVar1;
  }
  return (double)(~-(ulong)NAN(dVar1) & (ulong)dVar2 | -(ulong)NAN(dVar1) & (ulong)local_8);
}

Assistant:

double dds_get_max_addressable_value(struct dds_bucket_id_mapping *bid_mapping) {
    double den;
    switch (bid_mapping->type) {
        case LOG_UPPER:
            den = (1 - bid_mapping->alpha);
            break;
        case LOG_LOWER:
            den = (1 + bid_mapping->alpha);
            break;
        default:
            den = (1 - bid_mapping->alpha);
    }
    double max_addressable_value = fmin(exp(INT_MAX * bid_mapping->log_gamma),DBL_MAX / den);
    return max_addressable_value;
}